

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O0

int __thiscall
absl::synchronization_internal::GraphCycles::FindPath
          (GraphCycles *this,GraphId idx,GraphId idy,int max_path_len,GraphId *path)

{
  uint32_t index;
  bool bVar1;
  uint32_t uVar2;
  Node *pNVar3;
  uint32_t *puVar4;
  Node **ppNVar5;
  int32_t local_d8;
  int32_t local_d4;
  int32_t _cursor;
  int32_t w;
  uint64_t local_c8;
  uint32_t local_c0;
  int32_t n;
  undefined1 local_b0 [8];
  NodeSet seen;
  int path_len;
  int32_t y;
  int32_t local_54;
  GraphCycles *pGStack_50;
  int32_t x;
  uint64_t local_48;
  Rep *local_40;
  Rep *r;
  GraphId *path_local;
  GraphCycles *pGStack_28;
  int max_path_len_local;
  GraphCycles *this_local;
  GraphId idy_local;
  GraphId idx_local;
  
  local_40 = this->rep_;
  local_48 = idx.handle;
  r = (Rep *)path;
  path_local._4_4_ = max_path_len;
  pGStack_28 = this;
  this_local = (GraphCycles *)idy.handle;
  idy_local = idx;
  pNVar3 = FindNode(local_40,idx);
  if (pNVar3 != (Node *)0x0) {
    pGStack_50 = this_local;
    pNVar3 = FindNode(local_40,(GraphId)this_local);
    if (pNVar3 != (Node *)0x0) {
      local_54 = anon_unknown_0::NodeIndex(idy_local);
      uVar2 = anon_unknown_0::NodeIndex((GraphId)this_local);
      seen._52_4_ = 0;
      anon_unknown_0::NodeSet::NodeSet((NodeSet *)local_b0);
      anon_unknown_0::Vec<int>::clear(&local_40->stack_);
      anon_unknown_0::Vec<int>::push_back(&local_40->stack_,&local_54);
LAB_001c6807:
      do {
        bVar1 = anon_unknown_0::Vec<int>::empty(&local_40->stack_);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          idx_local.handle._4_4_ = 0;
LAB_001c6a0d:
          _cursor = 1;
          anon_unknown_0::NodeSet::~NodeSet((NodeSet *)local_b0);
          return idx_local.handle._4_4_;
        }
        puVar4 = (uint32_t *)anon_unknown_0::Vec<int>::back(&local_40->stack_);
        local_c0 = *puVar4;
        anon_unknown_0::Vec<int>::pop_back(&local_40->stack_);
        index = local_c0;
        if ((int)local_c0 < 0) {
          seen._52_4_ = seen._52_4_ + -1;
          goto LAB_001c6807;
        }
        if ((int)seen._52_4_ < path_local._4_4_) {
          ppNVar5 = anon_unknown_0::
                    Vec<absl::synchronization_internal::(anonymous_namespace)::Node_*>::operator[]
                              (&this->rep_->nodes_,local_c0);
          local_c8 = (uint64_t)anon_unknown_0::MakeId(index,(*ppNVar5)->version);
          (r->nodes_).space_[(long)(int)seen._52_4_ + -1] = (Node *)local_c8;
        }
        seen._52_4_ = seen._52_4_ + 1;
        w = -1;
        anon_unknown_0::Vec<int>::push_back(&local_40->stack_,&w);
        if (local_c0 == uVar2) {
          idx_local.handle._4_4_ = seen._52_4_;
          goto LAB_001c6a0d;
        }
        local_d8 = 0;
        while( true ) {
          ppNVar5 = anon_unknown_0::
                    Vec<absl::synchronization_internal::(anonymous_namespace)::Node_*>::operator[]
                              (&local_40->nodes_,local_c0);
          bVar1 = anon_unknown_0::NodeSet::Next(&(*ppNVar5)->out,&local_d8,&local_d4);
          if (!bVar1) break;
          bVar1 = anon_unknown_0::NodeSet::insert((NodeSet *)local_b0,local_d4);
          if (bVar1) {
            anon_unknown_0::Vec<int>::push_back(&local_40->stack_,&local_d4);
          }
        }
      } while( true );
    }
  }
  return 0;
}

Assistant:

int GraphCycles::FindPath(GraphId idx, GraphId idy, int max_path_len,
                          GraphId path[]) const {
  Rep* r = rep_;
  if (FindNode(r, idx) == nullptr || FindNode(r, idy) == nullptr) return 0;
  const int32_t x = NodeIndex(idx);
  const int32_t y = NodeIndex(idy);

  // Forward depth first search starting at x until we hit y.
  // As we descend into a node, we push it onto the path.
  // As we leave a node, we remove it from the path.
  int path_len = 0;

  NodeSet seen;
  r->stack_.clear();
  r->stack_.push_back(x);
  while (!r->stack_.empty()) {
    int32_t n = r->stack_.back();
    r->stack_.pop_back();
    if (n < 0) {
      // Marker to indicate that we are leaving a node
      path_len--;
      continue;
    }

    if (path_len < max_path_len) {
      path[path_len] = MakeId(n, rep_->nodes_[n]->version);
    }
    path_len++;
    r->stack_.push_back(-1);  // Will remove tentative path entry

    if (n == y) {
      return path_len;
    }

    HASH_FOR_EACH(w, r->nodes_[n]->out) {
      if (seen.insert(w)) {
        r->stack_.push_back(w);
      }
    }
  }

  return 0;
}